

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_flattened_struct_member
          (string *__return_storage_ptr__,CompilerGLSL *this,string *basename,SPIRType *type,
          uint32_t index)

{
  undefined4 in_register_00000084;
  string local_38;
  
  to_member_name_abi_cxx11_(&local_38,this,type,index);
  join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)basename,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e7de5,
             (char (*) [2])&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000084,index));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  ParsedIR::sanitize_underscores(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_flattened_struct_member(const string &basename, const SPIRType &type, uint32_t index)
{
	auto ret = join(basename, "_", to_member_name(type, index));
	ParsedIR::sanitize_underscores(ret);
	return ret;
}